

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

uint8_t __thiscall ymfm::ym2610::read_data(ym2610 *this)

{
  ssize_t sVar1;
  size_t in_RCX;
  void *in_RDX;
  uint8_t local_11;
  uint8_t result;
  ym2610 *this_local;
  
  if (this->m_address < 0xe) {
    sVar1 = ssg_engine::read(&this->m_ssg,this->m_address & 0xf,in_RDX,in_RCX);
    local_11 = (uint8_t)sVar1;
  }
  else if (this->m_address < 0x10) {
    local_11 = 0xff;
  }
  else {
    local_11 = this->m_address == 0xff;
  }
  return local_11;
}

Assistant:

uint8_t ym2610::read_data()
{
	uint8_t result = 0;
	if (m_address < 0x0e)
	{
		// 00-0D: Read from SSG
		result = m_ssg.read(m_address & 0x0f);
	}
	else if (m_address < 0x10)
	{
		// 0E-0F: I/O ports not supported
		result = 0xff;
	}
	else if (m_address == 0xff)
	{
		// FF: ID code
		result = 1;
	}
	return result;
}